

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate_expression.cpp
# Opt level: O3

bool duckdb::CollateExpression::Equal(CollateExpression *a,CollateExpression *b)

{
  size_t __n;
  int iVar1;
  pointer pPVar2;
  type pPVar3;
  
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&a->child);
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&b->child);
  iVar1 = (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[10])(pPVar2,pPVar3);
  if (((char)iVar1 != '\0') &&
     (__n = (a->collation)._M_string_length, __n == (b->collation)._M_string_length)) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((a->collation)._M_dataplus._M_p,(b->collation)._M_dataplus._M_p,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool CollateExpression::Equal(const CollateExpression &a, const CollateExpression &b) {
	if (!a.child->Equals(*b.child)) {
		return false;
	}
	if (a.collation != b.collation) {
		return false;
	}
	return true;
}